

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Fts5Data * fts5LeafRead(Fts5Index *p,i64 iRowid)

{
  Fts5Data *p_00;
  
  p_00 = fts5DataRead(p,iRowid);
  if (p_00 != (Fts5Data *)0x0) {
    if (p_00->szLeaf <= p_00->nn) {
      return p_00;
    }
    p->rc = 0x10b;
    sqlite3_free(p_00);
  }
  return (Fts5Data *)0x0;
}

Assistant:

static Fts5Data *fts5LeafRead(Fts5Index *p, i64 iRowid){
  Fts5Data *pRet = fts5DataRead(p, iRowid);
  if( pRet ){
    if( pRet->szLeaf>pRet->nn ){
      p->rc = FTS5_CORRUPT;
      fts5DataRelease(pRet);
      pRet = 0;
    }
  }
  return pRet;
}